

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

AggregateFunction * duckdb::HistogramExactFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  AggregateFunction *in_RDI;
  allocator_type *in_stack_fffffffffffffe68;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe70;
  iterator in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  LogicalType *local_110;
  aggregate_size_t state_size;
  LogicalType *return_type;
  AggregateFunction *name;
  AggregateFunction *this;
  LogicalType local_d8 [8];
  aggregate_update_t in_stack_ffffffffffffff30;
  aggregate_combine_t in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 uVar2;
  aggregate_simple_update_t in_stack_ffffffffffffff48;
  bind_aggregate_function_t in_stack_ffffffffffffff50;
  aggregate_destructor_t in_stack_ffffffffffffff58;
  LogicalType *statistics;
  aggregate_window_t in_stack_ffffffffffffff68;
  aggregate_serialize_t in_stack_ffffffffffffff70;
  aggregate_deserialize_t in_stack_ffffffffffffff78;
  LogicalType local_80 [24];
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_29 [41];
  
  this = (AggregateFunction *)local_29;
  name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_29 + 1),"histogram_exact",(allocator *)this);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff68,ANY);
  return_type = local_80;
  statistics = return_type;
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff48,ANY);
  duckdb::LogicalType::LIST(return_type);
  uVar2 = 0;
  local_68 = &stack0xffffffffffffff68;
  local_60 = 2;
  state_size = (aggregate_size_t)&stack0xffffffffffffff46;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xb40bb5);
  iVar1._M_len = in_stack_fffffffffffffe80;
  iVar1._M_array = in_stack_fffffffffffffe78;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffe70,iVar1,in_stack_fffffffffffffe68);
  duckdb::LogicalType::LogicalType(local_d8,MAP);
  AggregateFunction::AggregateFunction
            (this,(string *)name,(vector<duckdb::LogicalType,_true> *)in_RDI,return_type,state_size,
             (aggregate_initialize_t)&stack0xfffffffffffffe68,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff38,
             (aggregate_finalize_t)CONCAT17(uVar2,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
             (aggregate_statistics_t)statistics,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff78);
  duckdb::LogicalType::~LogicalType(local_d8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xb40c96);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xb40ca3);
  local_110 = (LogicalType *)&local_68;
  do {
    local_110 = local_110 + -0x18;
    duckdb::LogicalType::~LogicalType(local_110);
  } while (local_110 != (LogicalType *)&stack0xffffffffffffff68);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff48);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return name;
}

Assistant:

AggregateFunction HistogramExactFun::GetFunction() {
	return AggregateFunction("histogram_exact", {LogicalType::ANY, LogicalType::LIST(LogicalType::ANY)},
	                         LogicalTypeId::MAP, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr,
	                         HistogramBinBindFunction<HistogramExact>, nullptr);
}